

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O3

int secp256k1_ge_set_xo_var(secp256k1_ge *r,secp256k1_fe *x,int odd)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  int iVar4;
  
  iVar4 = secp256k1_ge_set_xquad(r,x);
  if (iVar4 == 0) {
    iVar4 = 0;
  }
  else {
    secp256k1_fe_normalize_var(&r->y);
    uVar1 = (r->y).n[0];
    iVar4 = 1;
    if (((uint)uVar1 & 1) != odd) {
      (r->y).n[0] = 0x3ffffbfffff0bc - uVar1;
      uVar1 = (r->y).n[2];
      uVar2 = (r->y).n[3];
      uVar3 = (r->y).n[4];
      (r->y).n[1] = 0x3ffffffffffffc - (r->y).n[1];
      (r->y).n[2] = 0x3ffffffffffffc - uVar1;
      (r->y).n[3] = 0x3ffffffffffffc - uVar2;
      (r->y).n[4] = 0x3fffffffffffc - uVar3;
    }
  }
  return iVar4;
}

Assistant:

static int secp256k1_ge_set_xo_var(secp256k1_ge *r, const secp256k1_fe *x, int odd) {
    if (!secp256k1_ge_set_xquad(r, x)) {
        return 0;
    }
    secp256k1_fe_normalize_var(&r->y);
    if (secp256k1_fe_is_odd(&r->y) != odd) {
        secp256k1_fe_negate(&r->y, &r->y, 1);
    }
    return 1;

}